

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haxx_unary_op.cxx
# Opt level: O2

void __thiscall HAXX_UNARY_OP::quaternion_unary_add::test_method(quaternion_unary_add *this)

{
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined **local_1d0;
  undefined1 local_1c8;
  undefined8 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0xa3);
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00150bc8;
  local_1e0 = 0x4018000000000000;
  local_1d8 = 0x4018000000000000;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_58 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1d0,&local_60,0xa3,1,2,&local_1e0,"p.real()",&local_1d8,"6.");
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0xa4);
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00150bc8;
  local_1e0 = 0x4020000000000000;
  local_1d8 = 0x4020000000000000;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_88 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1d0,&local_90,0xa4,1,2,&local_1e0,"p.imag_i()",&local_1d8,"8.");
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0xa5);
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00150bc8;
  local_1d8 = 0x4024000000000000;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_b8 = "";
  local_1e0 = 0x4024000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1d0,&local_c0,0xa5,1,2,&local_1e0,"p.imag_j()",&local_1d8,"10.");
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0xa6);
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00150bc8;
  local_1d8 = 0x4028000000000000;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_e8 = "";
  local_1e0 = 0x4028000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1d0,&local_f0,0xa6,1,2,&local_1e0,"p.imag_k()",&local_1d8,"12.");
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0xa9);
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00150bc8;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_118 = "";
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_1e0 = 0x3ff0000000000000;
  local_1d8 = 0x3ff0000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1d0,&local_120,0xa9,1,2,&local_1e0,"q.real()",&local_1d8,"1.");
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0xaa);
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00150bc8;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_1e0 = 0x4000000000000000;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_148 = "";
  local_1d8 = 0x4000000000000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1d0,&local_150,0xaa,1,2,&local_1e0,"q.imag_i()",&local_1d8,"2.");
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0xab);
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00150bc8;
  local_1e0 = 0x4008000000000000;
  local_1d8 = 0x4008000000000000;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_178 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1d0,&local_180,0xab,1,2,&local_1e0,"q.imag_j()",&local_1d8,"3.");
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0xac);
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_00150bc8;
  local_1e0 = 0x4010000000000000;
  local_1d8 = 0x4010000000000000;
  local_1c0 = &boost::unit_test::lazy_ostream::inst;
  local_1b8 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/haxx_unary_op.cxx";
  local_1a8 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&local_1d0,&local_1b0,0xac,1,2,&local_1e0,"q.imag_k()",&local_1d8,"4.");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(quaternion_unary_add)
{

  HAXX::quaternion<double> q(1.,2.,3.,4.), p(5.,6.,7.,8.);
  p += q;

  // Check that p has been changed properly
  BOOST_CHECK_EQUAL(p.real(),6.);
  BOOST_CHECK_EQUAL(p.imag_i(),8.);
  BOOST_CHECK_EQUAL(p.imag_j(),10.);
  BOOST_CHECK_EQUAL(p.imag_k(),12.);

  // Check that q is unchanged
  BOOST_CHECK_EQUAL(q.real(),1.);
  BOOST_CHECK_EQUAL(q.imag_i(),2.);
  BOOST_CHECK_EQUAL(q.imag_j(),3.);
  BOOST_CHECK_EQUAL(q.imag_k(),4.);
}